

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O0

Date asl::Date::now(void)

{
  Date *in_RDI;
  double t;
  Date extraout_XMM0_Qa;
  
  t = asl::now();
  Date(in_RDI,t);
  return (Date)extraout_XMM0_Qa._t;
}

Assistant:

Date Date::now()
{
#ifdef _WIN32
	FILETIME t;
	GetSystemTimeAsFileTime(&t);
	return Date(ft2t(t));
#else
	// return Date(::time(0));
	return Date(asl::now());
#endif
}